

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::GetManagedFontFromFontDescription(wchar_t *font_description)

{
  bool bVar1;
  undefined1 local_d8 [8];
  ON_Font font_characteristics;
  wchar_t *font_description_local;
  
  font_characteristics.m_managed_installed_font_and_bits = (ON__UINT_PTR)font_description;
  ON_Font((ON_Font *)local_d8);
  bVar1 = SetFromFontDescription
                    ((ON_Font *)local_d8,
                     (wchar_t *)font_characteristics.m_managed_installed_font_and_bits);
  if (bVar1) {
    font_description_local = (wchar_t *)ManagedFont((ON_Font *)local_d8);
  }
  else {
    font_description_local = (wchar_t *)0x0;
  }
  ~ON_Font((ON_Font *)local_d8);
  return (ON_Font *)font_description_local;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromFontDescription(
  const wchar_t* font_description
  )
{
  ON_Font font_characteristics;
  if ( false == font_characteristics.SetFromFontDescription(font_description) )
    return nullptr;
  return font_characteristics.ManagedFont();
}